

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lock.c
# Opt level: O1

int doclose(int dx,int dy,int dz)

{
  monst *pmVar1;
  level *plVar2;
  char cVar3;
  boolean bVar4;
  schar sVar5;
  schar sVar6;
  schar sVar7;
  int iVar8;
  uint uVar9;
  uint uVar10;
  undefined8 in_RAX;
  monst *mtmp;
  byte bVar11;
  long lVar12;
  char *pcVar13;
  long lVar14;
  bool bVar15;
  coord cc;
  schar unused;
  undefined8 uStack_38;
  
  uStack_38 = in_RAX;
  if (((youmonst.data)->mflags1 & 0x2000) == 0) {
    if ((u.utrap == 0) || (u.utraptype != 1)) {
      bVar15 = true;
      if (dz != -2 && (dy != -2 && dx != -2)) {
        cVar3 = u.ux + (char)dx;
        bVar11 = u.uy + (char)dy;
        uStack_38._7_1_ = (undefined1)((ulong)in_RAX >> 0x38);
        uStack_38._0_7_ = CONCAT16(bVar11,CONCAT15(cVar3,(int5)in_RAX));
        bVar15 = 0x14 < bVar11 || (byte)(cVar3 + 0xb0U) < 0xb1;
      }
      if (bVar15) {
        iVar8 = get_adjacent_loc((char *)0x0,(char *)0x0,u.ux,u.uy,(coord *)((long)&uStack_38 + 5),
                                 (schar *)((long)&uStack_38 + 7));
        if (iVar8 == 0) {
          return 0;
        }
        if (bVar15) {
          dx = (uint)uStack_38._5_1_ - (uint)(byte)u.ux;
          dy = (uint)uStack_38._6_1_ - (uint)(byte)u.uy;
        }
      }
      plVar2 = level;
      lVar14 = (long)(char)uStack_38._5_1_;
      if ((uStack_38._5_1_ == u.ux) && (uStack_38._6_1_ == u.uy)) {
        pline("You are in the way!");
        return 1;
      }
      lVar12 = (long)(char)uStack_38._6_1_;
      pmVar1 = level->monsters[lVar14][lVar12];
      mtmp = (monst *)0x0;
      if ((pmVar1 != (monst *)0x0) && ((pmVar1->field_0x61 & 2) == 0)) {
        mtmp = pmVar1;
      }
      if ((((mtmp != (monst *)0x0) && (mtmp->m_ap_type == '\x01')) &&
          ((mtmp->mappearance == 0x1c || (mtmp->mappearance == 0x1b)))) &&
         ((u.uprops[0x17].intrinsic == 0 && (u.uprops[0x17].extrinsic == 0)))) {
        stumble_onto_mimic(mtmp,(schar)dx,(schar)dy);
        return 1;
      }
      cVar3 = level->locations[lVar14][lVar12].typ;
      if (cVar3 == '\x17') {
        if ((*(ushort *)&level->locations[lVar14][lVar12].field_0x6 & 0x1f0) == 0) {
          pcVar13 = "This doorway has no door.";
        }
        else {
          bVar4 = obstructed((int)(char)uStack_38._5_1_,(int)(char)uStack_38._6_1_);
          if (bVar4 != '\0') {
            return 0;
          }
          uVar10 = *(uint *)&plVar2->locations[lVar14][lVar12].field_0x6;
          uVar9 = uVar10 >> 4 & 0x1f;
          if (uVar9 == 1) {
            pcVar13 = "This door is broken.";
          }
          else if ((uVar10 & 0xc0) == 0) {
            if (uVar9 != 2) {
              return 1;
            }
            if (u.usteed != (monst *)0x0 || (youmonst.data)->msize != '\0') {
              if (u.usteed != (monst *)0x0) {
LAB_001b63df:
                pline("The door closes.");
                *(uint *)&plVar2->locations[lVar14][lVar12].field_0x6 =
                     *(uint *)&plVar2->locations[lVar14][lVar12].field_0x6 & 0xfffffe0e | 0x41;
                map_background(uStack_38._5_1_,uStack_38._6_1_,1);
                if ((((u.uprops[0x1e].intrinsic == 0) &&
                     ((ublindf == (obj *)0x0 || (ublindf->otyp == 0xed)))) &&
                    (((youmonst.data)->mflags1 & 0x1000) == 0)) ||
                   ((ublindf != (obj *)0x0 && (ublindf->oartifact == '\x1d')))) {
                  newsym((int)(char)uStack_38._5_1_,(int)(char)uStack_38._6_1_);
                }
                else {
                  feel_location(uStack_38._5_1_,uStack_38._6_1_);
                }
                block_point((int)(char)uStack_38._5_1_,(int)(char)uStack_38._6_1_);
                return 1;
              }
              uVar10 = mt_random();
              sVar5 = acurrstr();
              sVar6 = acurr(3);
              sVar7 = acurr(4);
              if ((int)(uVar10 % 0x19) < ((int)sVar7 + (int)sVar6 + (int)sVar5) / 3)
              goto LAB_001b63df;
              iVar8 = 1;
              exercise(0,'\x01');
              pcVar13 = "The door resists!";
              goto LAB_001b60f9;
            }
            pcVar13 = "You\'re too small to push the door closed.";
          }
          else {
            pcVar13 = "This door is already closed.";
          }
        }
      }
      else {
        if (cVar3 != '$') {
          if ((u.uprops[0x1e].intrinsic == 0) &&
             (((ublindf == (obj *)0x0 || (ublindf->otyp == 0xed)) &&
              (((youmonst.data)->mflags1 & 0x1000) == 0)))) {
            pcVar13 = "see";
          }
          else if (ublindf == (obj *)0x0) {
            pcVar13 = "feel";
          }
          else {
            pcVar13 = "feel";
            if (ublindf->oartifact == '\x1d') {
              pcVar13 = "see";
            }
          }
          pline("You %s no door there.",pcVar13);
          return 0;
        }
        pcVar13 = "There is no obvious way to close the drawbridge.";
      }
    }
    else {
      pcVar13 = "You can\'t reach over the edge of the pit.";
    }
  }
  else {
    pcVar13 = "You can\'t close anything -- you have no hands!";
  }
  iVar8 = 0;
LAB_001b60f9:
  pline(pcVar13);
  return iVar8;
}

Assistant:

int doclose(int dx, int dy, int dz)
{
        boolean got_dir = FALSE;
	struct rm *door;
	struct monst *mtmp;
        coord cc;
        schar unused;

	if (nohands(youmonst.data)) {
	    pline("You can't close anything -- you have no hands!");
	    return 0;
	}

	if (u.utrap && u.utraptype == TT_PIT) {
	    pline("You can't reach over the edge of the pit.");
	    return 0;
	}

	if (dx != -2 && dy != -2 && dz != -2) { /* -2 signals no direction given  */
	    cc.x = u.ux + dx;
	    cc.y = u.uy + dy;
	    if (isok(cc.x, cc.y))
		got_dir = TRUE;
	}

	if (!got_dir && !get_adjacent_loc(NULL, NULL, u.ux, u.uy, &cc, &unused))
	    return 0;

        if (!got_dir) {
          dx = cc.x-u.ux;
          dy = cc.y-u.uy;
          dz = 0;
        }

	if ((cc.x == u.ux) && (cc.y == u.uy)) {
		pline("You are in the way!");
		return 1;
	}

	if ((mtmp = m_at(level, cc.x, cc.y))		&&
		mtmp->m_ap_type == M_AP_FURNITURE	&&
		(mtmp->mappearance == S_hcdoor ||
			mtmp->mappearance == S_vcdoor)	&&
		!Protection_from_shape_changers)	 {

	    stumble_onto_mimic(mtmp, dx, dy);
	    return 1;
	}

	door = &level->locations[cc.x][cc.y];

	if (!IS_DOOR(door->typ)) {
		if (door->typ == DRAWBRIDGE_DOWN)
		    pline("There is no obvious way to close the drawbridge.");
		else
		    pline("You %s no door there.",
				Blind ? "feel" : "see");
		return 0;
	}

	if (door->doormask == D_NODOOR) {
	    pline("This doorway has no door.");
	    return 0;
	}

	if (obstructed(cc.x, cc.y)) return 0;

	if (door->doormask == D_BROKEN) {
	    pline("This door is broken.");
	    return 0;
	}

	if (door->doormask & (D_CLOSED | D_LOCKED)) {
	    pline("This door is already closed.");
	    return 0;
	}

	if (door->doormask == D_ISOPEN) {
	    if (verysmall(youmonst.data) && !u.usteed) {
		 pline("You're too small to push the door closed.");
		 return 0;
	    }
	    if (u.usteed ||
		rn2(25) < (ACURRSTR+ACURR(A_DEX)+ACURR(A_CON))/3) {
		pline("The door closes.");
		door->doormask = D_CLOSED;
		door->mem_door_l = 1;
		/*
		 * map_background() here sets the mem_door flags correctly;
		 * and it's redundant to both feel_location() and newsym()
		 * with a door.
		 *
		 * Exception: if we remember an invisible monster on the
		 * door square, but in this case, we want to set the
		 * memory of a door there anyway because we know there's a
		 * door there because we just closed it, and with layered
		 * memory this doesn't clash with keeping the I there.
		 */
		map_background(cc.x, cc.y, TRUE);
		if (Blind)
		    feel_location(cc.x,cc.y);	/* the hero knows she closed it */
		else
		    newsym(cc.x,cc.y);
		block_point(cc.x,cc.y);	/* vision:  no longer see there */
	    }
	    else {
	        exercise(A_STR, TRUE);
	        pline("The door resists!");
	    }
	}

	return 1;
}